

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

InternalRunDeathTestFlag * testing::internal::ParseInternalRunDeathTestFlag(void)

{
  bool bVar1;
  size_type sVar2;
  InternalRunDeathTestFlag *this;
  int write_fd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fields;
  int index;
  int line;
  int in_stack_ffffffffffffff4c;
  String *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  undefined5 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff65;
  undefined1 in_stack_ffffffffffffff66;
  undefined1 in_stack_ffffffffffffff67;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  String *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  allocator<char> local_55 [13];
  string local_48 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffc0;
  char in_stack_ffffffffffffffcf;
  string *in_stack_ffffffffffffffd0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  undefined4 local_10;
  undefined4 local_c;
  InternalRunDeathTestFlag *local_8;
  
  bVar1 = String::operator==(in_stack_ffffffffffffff80,
                             (char *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  if (bVar1) {
    return (InternalRunDeathTestFlag *)0x0;
  }
  local_c = 0xffffffff;
  local_10 = 0xffffffff;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1f8994);
  String::c_str((String *)FLAGS_gtest_internal_run_death_test);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
             (allocator<char> *)in_stack_ffffffffffffff80);
  SplitString(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(local_55);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_28);
  if (sVar2 == 4) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_28,1);
    in_stack_ffffffffffffff67 =
         ParseNaturalNumber<int>(in_stack_ffffffffffffff88,(int *)in_stack_ffffffffffffff80);
    if ((bool)in_stack_ffffffffffffff67) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_28,2);
      in_stack_ffffffffffffff66 =
           ParseNaturalNumber<int>(in_stack_ffffffffffffff88,(int *)in_stack_ffffffffffffff80);
      if ((bool)in_stack_ffffffffffffff66) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_28,3);
        in_stack_ffffffffffffff65 =
             ParseNaturalNumber<int>(in_stack_ffffffffffffff88,(int *)in_stack_ffffffffffffff80);
        if ((bool)in_stack_ffffffffffffff65) goto LAB_001f8b5b;
      }
    }
  }
  in_stack_ffffffffffffff58 = (string *)String::c_str((String *)FLAGS_gtest_internal_run_death_test)
  ;
  String::Format(&stack0xffffffffffffff90,"Bad --gtest_internal_run_death_test flag: %s",
                 in_stack_ffffffffffffff58);
  DeathTestAbort((String *)
                 CONCAT17(in_stack_ffffffffffffff67,
                          CONCAT16(in_stack_ffffffffffffff66,
                                   CONCAT15(in_stack_ffffffffffffff65,in_stack_ffffffffffffff60))));
  String::~String(in_stack_ffffffffffffff50);
LAB_001f8b5b:
  this = (InternalRunDeathTestFlag *)operator_new(0x20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](&local_28,0);
  String::String((String *)
                 CONCAT17(in_stack_ffffffffffffff67,
                          CONCAT16(in_stack_ffffffffffffff66,
                                   CONCAT15(in_stack_ffffffffffffff65,in_stack_ffffffffffffff60))),
                 in_stack_ffffffffffffff58);
  InternalRunDeathTestFlag::InternalRunDeathTestFlag
            ((InternalRunDeathTestFlag *)
             CONCAT17(in_stack_ffffffffffffff67,
                      CONCAT16(in_stack_ffffffffffffff66,
                               CONCAT15(in_stack_ffffffffffffff65,in_stack_ffffffffffffff60))),
             (String *)in_stack_ffffffffffffff58,(int)((ulong)this >> 0x20),(int)this,
             in_stack_ffffffffffffff4c);
  local_8 = this;
  String::~String(&this->file_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_ffffffffffffff67,
                        CONCAT16(in_stack_ffffffffffffff66,
                                 CONCAT15(in_stack_ffffffffffffff65,in_stack_ffffffffffffff60))));
  return local_8;
}

Assistant:

InternalRunDeathTestFlag* ParseInternalRunDeathTestFlag() {
  if (GTEST_FLAG(internal_run_death_test) == "") return NULL;

  // GTEST_HAS_DEATH_TEST implies that we have ::std::string, so we
  // can use it here.
  int line = -1;
  int index = -1;
  ::std::vector< ::std::string> fields;
  SplitString(GTEST_FLAG(internal_run_death_test).c_str(), '|', &fields);
  int write_fd = -1;

# if GTEST_OS_WINDOWS

  unsigned int parent_process_id = 0;
  size_t write_handle_as_size_t = 0;
  size_t event_handle_as_size_t = 0;

  if (fields.size() != 6
      || !ParseNaturalNumber(fields[1], &line)
      || !ParseNaturalNumber(fields[2], &index)
      || !ParseNaturalNumber(fields[3], &parent_process_id)
      || !ParseNaturalNumber(fields[4], &write_handle_as_size_t)
      || !ParseNaturalNumber(fields[5], &event_handle_as_size_t)) {
    DeathTestAbort(String::Format(
        "Bad --gtest_internal_run_death_test flag: %s",
        GTEST_FLAG(internal_run_death_test).c_str()));
  }
  write_fd = GetStatusFileDescriptor(parent_process_id,
                                     write_handle_as_size_t,
                                     event_handle_as_size_t);
# else

  if (fields.size() != 4
      || !ParseNaturalNumber(fields[1], &line)
      || !ParseNaturalNumber(fields[2], &index)
      || !ParseNaturalNumber(fields[3], &write_fd)) {
    DeathTestAbort(String::Format(
        "Bad --gtest_internal_run_death_test flag: %s",
        GTEST_FLAG(internal_run_death_test).c_str()));
  }

# endif  // GTEST_OS_WINDOWS

  return new InternalRunDeathTestFlag(fields[0], line, index, write_fd);
}